

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O1

string * clask::html_encode(string *__return_storage_ptr__,string *value)

{
  byte bVar1;
  size_type sVar2;
  byte *pbVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  sVar2 = value->_M_string_length;
  if (sVar2 != 0) {
    pbVar3 = (byte *)(value->_M_dataplus)._M_p;
    do {
      bVar1 = *pbVar3;
      if (bVar1 < 0x27) {
        if ((bVar1 != 0x22) && (bVar1 != 0x26)) goto LAB_0010c023;
LAB_0010c011:
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else {
        if ((bVar1 == 0x27) || ((bVar1 == 0x3c || (bVar1 == 0x3e)))) goto LAB_0010c011;
LAB_0010c023:
        std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)pbVar3);
      }
      pbVar3 = pbVar3 + 1;
      sVar2 = sVar2 - 1;
    } while (sVar2 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string html_encode(const std::string& value) {
  std::string buf;
  buf.reserve(value.size());
  for (const char & c : value) {
    switch (c) {
      case '&':  buf.append("&amp;");  break;
      case '\"': buf.append("&quot;"); break;
      case '\'': buf.append("&apos;"); break;
      case '<':  buf.append("&lt;");   break;
      case '>':  buf.append("&gt;");   break;
      default:   buf.append(&c, 1); break;
    }
  }
  return buf;
}